

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

bool __thiscall wasm::anon_unknown_0::RecGroupEquator::eq(RecGroupEquator *this,Type a,Type b)

{
  int iVar1;
  uintptr_t *puVar2;
  uintptr_t *puVar3;
  ulong in_RCX;
  uintptr_t *puVar4;
  bool bVar5;
  
  if (in_RCX < 7 || b.id < 7) {
    bVar5 = b.id == in_RCX;
  }
  else {
    iVar1 = *(int *)(b.id + 4);
    if (iVar1 == *(int *)(in_RCX + 4)) {
      if (iVar1 == 1) {
        if (*(int *)(b.id + 0x10) == *(int *)(in_RCX + 0x10)) {
          bVar5 = eq(this,(HeapType)a.id,(HeapType)*(uintptr_t *)(b.id + 8));
          return bVar5;
        }
      }
      else {
        if (iVar1 != 0) {
          handle_unreachable("unexpected kind",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-type.cpp"
                             ,0x8be);
        }
        puVar2 = *(uintptr_t **)(b.id + 8);
        puVar3 = *(uintptr_t **)(b.id + 0x10);
        if ((long)puVar3 - (long)puVar2 == *(long *)(in_RCX + 0x10) - *(long *)(in_RCX + 8)) {
          if (puVar2 == puVar3) {
            return true;
          }
          do {
            puVar4 = puVar2 + 1;
            bVar5 = eq(this,a,(Type)*puVar2);
            if (!bVar5) {
              return bVar5;
            }
            puVar2 = puVar4;
          } while (puVar4 != puVar3);
          return bVar5;
        }
      }
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool RecGroupEquator::eq(Type a, Type b) const {
  if (a.isBasic() || b.isBasic()) {
    return a == b;
  }
  return eq(*getTypeInfo(a), *getTypeInfo(b));
}